

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O2

int mm_read_mtx_crd_data(FILE *f,int M,int N,int nz,int *I,int *J,double *val,char *matcode)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  cVar1 = matcode[2];
  if (cVar1 == 'C') {
    uVar4 = (ulong)(uint)nz;
    if (nz < 1) {
      uVar4 = 0;
    }
    lVar3 = uVar4 + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return 0;
      }
      iVar2 = __isoc99_fscanf(f,"%d %d %lg %lg",I,J,val,val + 1);
      I = I + 1;
      val = val + 2;
      J = J + 1;
    } while (iVar2 == 4);
  }
  else {
    if (cVar1 != 'R') {
      if (cVar1 != 'P') {
        return 0xf;
      }
      uVar4 = (ulong)(uint)nz;
      if (nz < 1) {
        uVar4 = 0;
      }
      lVar3 = uVar4 + 1;
      do {
        lVar3 = lVar3 + -1;
        if (lVar3 == 0) {
          return 0;
        }
        iVar2 = __isoc99_fscanf(f,"%d %d",I,J);
        I = I + 1;
        J = J + 1;
      } while (iVar2 == 2);
      return 0xc;
    }
    uVar4 = (ulong)(uint)nz;
    if (nz < 1) {
      uVar4 = 0;
    }
    lVar3 = uVar4 + 1;
    do {
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return 0;
      }
      iVar2 = __isoc99_fscanf(f,"%d %d %lg\n",I,J,val);
      I = I + 1;
      val = val + 1;
      J = J + 1;
    } while (iVar2 == 3);
  }
  return 0xc;
}

Assistant:

int mm_read_mtx_crd_data(FILE *f, int M, int N, int nz, int I[], int J[],
                         double val[], MM_typecode matcode) {
    int i;
    if (mm_is_complex(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d %lg %lg", &I[i], &J[i], &val[2 * i], &val[2 * i + 1])
                != 4)
                return MM_PREMATURE_EOF;
    } else if (mm_is_real(matcode)) {
        for (i = 0; i < nz; i++) {
            if (fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i])
                != 3)
                return MM_PREMATURE_EOF;

        }
    } else if (mm_is_pattern(matcode)) {
        for (i = 0; i < nz; i++)
            if (fscanf(f, "%d %d", &I[i], &J[i])
                != 2)
                return MM_PREMATURE_EOF;
    } else
        return MM_UNSUPPORTED_TYPE;

    return 0;

}